

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O1

void lws_set_timeout_us(lws *wsi,pending_timeout reason,lws_usec_t us)

{
  char cVar1;
  lws_context *plVar2;
  lws_usec_t lVar3;
  lws_log_cx *cx;
  
  plVar2 = (wsi->a).context;
  cVar1 = wsi->tsi;
  lws_dll2_remove(&(wsi->sul_timeout).list);
  if (us != 0) {
    lVar3 = lws_now_usecs();
    (wsi->sul_timeout).us = lVar3 + us;
    __lws_sul_insert(plVar2->pt[cVar1].pt_sul_owner,&wsi->sul_timeout);
    cx = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,4,"lws_set_timeout_us","%llu us, reason %d",us,reason);
    wsi->pending_timeout = (char)reason;
  }
  return;
}

Assistant:

void
lws_set_timeout_us(struct lws *wsi, enum pending_timeout reason, lws_usec_t us)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];

	lws_pt_lock(pt, __func__);
	lws_dll2_remove(&wsi->sul_timeout.list);
	lws_pt_unlock(pt);

	if (!us)
		return;

	lws_pt_lock(pt, __func__);
	__lws_sul_insert_us(&pt->pt_sul_owner[LWSSULLI_MISS_IF_SUSPENDED],
			    &wsi->sul_timeout, us);

	lwsl_wsi_notice(wsi, "%llu us, reason %d",
			     (unsigned long long)us, reason);

	wsi->pending_timeout = (char)reason;
	lws_pt_unlock(pt);
}